

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O0

int ptls_get_pem_object(FILE *F,char *label,ptls_buffer_t *buf)

{
  int iVar1;
  char *pcVar2;
  FILE *in_RDI;
  bool bVar3;
  ptls_base64_decode_state_t state;
  char line [256];
  int ret;
  int local_138;
  int in_stack_fffffffffffffed0;
  uint32_t in_stack_fffffffffffffed4;
  char *in_stack_fffffffffffffed8;
  ptls_buffer_t *in_stack_fffffffffffffee0;
  ptls_base64_decode_state_t *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef0;
  int local_1c;
  
  local_1c = 0x233;
  do {
    pcVar2 = fgets(&stack0xfffffffffffffed8,0x100,in_RDI);
    if (pcVar2 == (char *)0x0) goto LAB_00109220;
    iVar1 = ptls_compare_separator_line
                      ((char *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                       (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  } while (iVar1 != 0);
  local_1c = 0;
  ptls_base64_decode_init((ptls_base64_decode_state_t *)&local_138);
LAB_00109220:
  while( true ) {
    bVar3 = false;
    if (local_1c == 0) {
      pcVar2 = fgets(&stack0xfffffffffffffed8,0x100,in_RDI);
      bVar3 = pcVar2 != (char *)0x0;
    }
    if (!bVar3) break;
    iVar1 = ptls_compare_separator_line
                      ((char *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                       (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    if (iVar1 == 0) {
      if ((in_stack_fffffffffffffed0 == 0) || ((in_stack_fffffffffffffed0 == 1 && (local_138 == 0)))
         ) {
        local_1c = 0;
      }
      else {
        local_1c = 0x232;
      }
      return local_1c;
    }
    local_1c = ptls_base64_decode(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                                  in_stack_fffffffffffffee0);
  }
  return local_1c;
}

Assistant:

static int ptls_get_pem_object(FILE *F, const char *label, ptls_buffer_t *buf)
{
    int ret = PTLS_ERROR_PEM_LABEL_NOT_FOUND;
    char line[256];
    ptls_base64_decode_state_t state;

    /* Get the label on a line by itself */
    while (fgets(line, 256, F)) {
        if (ptls_compare_separator_line(line, "BEGIN", label) == 0) {
            ret = 0;
            ptls_base64_decode_init(&state);
            break;
        }
    }
    /* Get the data in the buffer */
    while (ret == 0 && fgets(line, 256, F)) {
        if (ptls_compare_separator_line(line, "END", label) == 0) {
            if (state.status == PTLS_BASE64_DECODE_DONE || (state.status == PTLS_BASE64_DECODE_IN_PROGRESS && state.nbc == 0)) {
                ret = 0;
            } else {
                ret = PTLS_ERROR_INCORRECT_BASE64;
            }
            break;
        } else {
            ret = ptls_base64_decode(line, &state, buf);
        }
    }

    return ret;
}